

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

JSONWriter * __thiscall
hgdb::json::JSONWriter::value<std::__cxx11::string>
          (JSONWriter *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value
          )

{
  ostream *poVar1;
  char *in_RCX;
  undefined1 auVar2 [16];
  string_view value_00;
  string local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  JSONWriter *this_local;
  
  local_18 = value;
  value_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  poVar1 = std::operator<<((ostream *)&(this->s_).field_0x10,'\"');
  auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)value);
  value_00._M_len = auVar2._8_8_;
  value_00._M_str = in_RCX;
  escape_abi_cxx11_(&local_38,auVar2._0_8_,value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  std::operator<<(poVar1,'\"');
  std::__cxx11::string::~string((string *)&local_38);
  std::operator<<((ostream *)&(this->s_).field_0x10,',');
  return this;
}

Assistant:

JSONWriter &value(T value) {
        // if it's an array
        if constexpr (std::is_same_v<T, const char *> || std::is_same_v<T, std::string> ||
                      std::is_same_v<T, std::string_view>) {
            s_ << '"' << escape(value) << '"';
        } else if constexpr (std::is_same_v<T, bool>) {
            s_ << (value ? "true" : "false");
        } else {
            s_ << value;
        }
        s_ << ',';
        return *this;
    }